

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O0

char * raviP_instruction_to_str(char *buf,size_t n,Instruction i)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint local_a4;
  uint local_7c;
  int sbx;
  int bx;
  int ax;
  int c;
  int b;
  int a;
  OpCode o;
  Instruction i_local;
  size_t n_local;
  char *buf_local;
  
  uVar1 = i & 0xff;
  uVar2 = i >> 8 & 0x7f;
  local_7c = i >> 0x18;
  local_a4 = i >> 0x10 & 0xff;
  a._2_2_ = (ushort)(i >> 0x10);
  snprintf(buf,n,"%s ",luaP_opnames[uVar1]);
  switch(luaP_opmodes[uVar1] & 3) {
  case 0:
    sVar3 = strlen(buf);
    sVar4 = strlen(buf);
    snprintf(buf + sVar3,n - sVar4,"A=%d",(ulong)uVar2);
    if (((int)(uint)luaP_opmodes[uVar1] >> 4 & 3U) != 0) {
      sVar3 = strlen(buf);
      sVar4 = strlen(buf);
      if ((((int)(uint)luaP_opmodes[uVar1] >> 4 & 3U) == 3) && ((i & 0x80000000) != 0)) {
        local_7c = -(local_7c & 0x7f) - 1;
      }
      snprintf(buf + sVar3,n - sVar4," B=%d",(ulong)local_7c);
    }
    if (((int)(uint)luaP_opmodes[uVar1] >> 2 & 3U) != 0) {
      sVar3 = strlen(buf);
      sVar4 = strlen(buf);
      if ((((int)(uint)luaP_opmodes[uVar1] >> 2 & 3U) == 3) && ((i & 0x800000) != 0)) {
        local_a4 = -(i >> 0x10 & 0x7f) - 1;
      }
      snprintf(buf + sVar3,n - sVar4," C=%d",(ulong)local_a4);
    }
    break;
  case 1:
    sVar3 = strlen(buf);
    sVar4 = strlen(buf);
    snprintf(buf + sVar3,n - sVar4,"A=%d",(ulong)uVar2);
    if (((int)(uint)luaP_opmodes[uVar1] >> 4 & 3U) == 3) {
      sVar3 = strlen(buf);
      sVar4 = strlen(buf);
      snprintf(buf + sVar3,n - sVar4," Bx=%d",(ulong)(-(uint)a._2_2_ - 1));
    }
    if (((int)(uint)luaP_opmodes[uVar1] >> 4 & 3U) == 1) {
      sVar3 = strlen(buf);
      sVar4 = strlen(buf);
      snprintf(buf + sVar3,n - sVar4," Bx=%d",(ulong)(uint)a._2_2_);
    }
    break;
  case 2:
    sVar3 = strlen(buf);
    sVar4 = strlen(buf);
    snprintf(buf + sVar3,n - sVar4,"As=%d Bx=%d",(ulong)uVar2,(ulong)(a._2_2_ - 0x8000));
    break;
  case 3:
    sVar3 = strlen(buf);
    sVar4 = strlen(buf);
    snprintf(buf + sVar3,n - sVar4,"Ax=%d",(ulong)(-(i >> 8) - 1));
  }
  return buf;
}

Assistant:

const char* raviP_instruction_to_str(char *buf, size_t n, Instruction i) {
  OpCode o = GET_OPCODE(i);
  int a = GETARG_A(i);
  int b = GETARG_B(i);
  int c = GETARG_C(i);
  int ax = GETARG_Ax(i);
  int bx = GETARG_Bx(i);
  int sbx = GETARG_sBx(i);
  snprintf(buf, n, "%s ", luaP_opnames[o]);
  switch (getOpMode(o)) {
  case iABC:
    snprintf(buf+strlen(buf), n-strlen(buf), "A=%d", a);
    if (getBMode(o) != OpArgN)
      snprintf(buf + strlen(buf), n - strlen(buf), " B=%d", (getBMode(o) == OpArgK && ISK(b)) ? (MYK(INDEXK(b))) : b);
    if (getCMode(o) != OpArgN)
      snprintf(buf + strlen(buf), n - strlen(buf), " C=%d", (getCMode(o) == OpArgK && ISK(c)) ? (MYK(INDEXK(c))) : c);
    break;
  case iABx:
    snprintf(buf + strlen(buf), n - strlen(buf), "A=%d", a);
    if (getBMode(o) == OpArgK)
      snprintf(buf + strlen(buf), n - strlen(buf), " Bx=%d", MYK(bx));
    if (getBMode(o) == OpArgU)
      snprintf(buf + strlen(buf), n - strlen(buf), " Bx=%d", bx);
    break;
  case iAsBx:
    snprintf(buf + strlen(buf), n - strlen(buf), "As=%d Bx=%d", a, sbx);
    break;
  case iAx:
    snprintf(buf + strlen(buf), n - strlen(buf), "Ax=%d", MYK(ax));
    break;
  }
  return buf;
}